

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCluster.cpp
# Opt level: O0

string * __thiscall TypeCluster::SoftPrint_abi_cxx11_(TypeCluster *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppTVar3;
  long in_RSI;
  string *in_RDI;
  type_ci last;
  type_ci it;
  stringstream ss;
  set<Type_*,_std::less<Type_*>,_std::allocator<Type_*>_> *in_stack_fffffffffffffde8;
  ostream *poVar4;
  int iVar5;
  string local_1d8 [32];
  _Self local_1b8;
  _Self local_1b0 [3];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"tcI");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(in_RSI + 0x30));
  std::operator<<(poVar2,"={ ");
  local_1b0[0]._M_node =
       (_Base_ptr)
       std::set<Type_*,_std::less<Type_*>,_std::allocator<Type_*>_>::begin
                 (in_stack_fffffffffffffde8);
  local_1b8._M_node =
       (_Base_ptr)
       std::set<Type_*,_std::less<Type_*>,_std::allocator<Type_*>_>::end(in_stack_fffffffffffffde8);
  while (bVar1 = std::operator!=(local_1b0,&local_1b8), bVar1) {
    poVar4 = local_188;
    ppTVar3 = std::_Rb_tree_const_iterator<Type_*>::operator*
                        ((_Rb_tree_const_iterator<Type_*> *)0x8cced2);
    (*(*ppTVar3)->_vptr_Type[3])(local_1d8);
    std::operator<<(poVar4,local_1d8);
    iVar5 = (int)((ulong)poVar4 >> 0x20);
    std::__cxx11::string::~string(local_1d8);
    std::_Rb_tree_const_iterator<Type_*>::operator++
              ((_Rb_tree_const_iterator<Type_*> *)poVar2,iVar5);
    bVar1 = std::operator!=(local_1b0,&local_1b8);
    if (bVar1) {
      std::operator<<(local_188," | ");
    }
  }
  std::operator<<(local_188," }");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string TypeCluster::SoftPrint() const
{
    stringstream ss;
    ss << "tcI"<<_m_i<<"={ ";

    type_ci it = _m_types.begin();
    type_ci last = _m_types.end();

    while(it != last)
    {
        ss << (*it)->SoftPrint();        
        it++;
        if(it != last)
            ss << " | ";       
    }
    ss << " }";
    return(ss.str());
}